

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_workspace.cpp
# Opt level: O0

void * __thiscall ON_Workspace::GrowMemory(ON_Workspace *this,void *p,size_t size)

{
  ON_Workspace_MBLK *local_30;
  ON_Workspace_MBLK *pBlk;
  void *newp;
  size_t size_local;
  void *p_local;
  ON_Workspace *this_local;
  
  pBlk = (ON_Workspace_MBLK *)0x0;
  if (p == (void *)0x0) {
    pBlk = (ON_Workspace_MBLK *)GetMemory(this,size);
  }
  else {
    for (local_30 = this->m_pMemBlk; local_30 != (ON_Workspace_MBLK *)0x0;
        local_30 = local_30->pNext) {
      if (local_30->pMem == p) {
        pBlk = (ON_Workspace_MBLK *)p;
        if (size != 0) {
          pBlk = (ON_Workspace_MBLK *)onrealloc(p,size);
        }
        local_30->pMem = pBlk;
        return pBlk;
      }
    }
  }
  return pBlk;
}

Assistant:

void* ON_Workspace::GrowMemory( void* p, size_t size )
{
  void* newp = nullptr;
  if ( !p ) {
    newp = GetMemory(size);
  }
  else {
    struct ON_Workspace_MBLK* pBlk = m_pMemBlk;
    while ( pBlk ) {
      if ( pBlk->pMem == p ) {
        if ( size > 0 ) {
          newp = onrealloc(p,size);
        }
        else {
          newp = p;
        }
        pBlk->pMem = newp;
        break;
      }
      pBlk = pBlk->pNext;
    }
  }
  return newp;
}